

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.cpp
# Opt level: O0

bool __thiscall
SBPL2DGridSearch::search
          (SBPL2DGridSearch *this,uchar **Grid2D,uchar obsthresh,int startx_c,int starty_c,
          int goalx_c,int goaly_c,SBPL_2DGRIDSEARCH_TERM_CONDITION termination_condition)

{
  _Ios_Openmode _Var1;
  ostream *poVar2;
  undefined8 uVar3;
  long in_RDI;
  int in_stack_00000008;
  stringstream ss;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int iVar4;
  undefined4 in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  allocator<char> local_1d1;
  string local_1d0 [32];
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  uchar in_stack_fffffffffffffe5f;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  uchar **in_stack_fffffffffffffe70;
  SBPL2DGridSearch *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  SBPL_2DGRIDSEARCH_TERM_CONDITION in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  SBPL_2DGRIDSEARCH_TERM_CONDITION in_stack_fffffffffffffe98;
  bool local_1;
  
  in_stack_00000008 = in_stack_00000008 / *(int *)(in_RDI + 0x20c);
  iVar4 = *(int *)(in_RDI + 0x1e8);
  if (iVar4 == 0) {
    local_1 = search_withheap(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                              (uchar)((uint)in_stack_fffffffffffffe6c >> 0x18),
                              in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                              in_stack_fffffffffffffe60,in_stack_fffffffffffffe90,
                              in_stack_fffffffffffffe98);
  }
  else {
    if (iVar4 != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,iVar4));
      _Var1 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&stack0xfffffffffffffe50,local_1d0,_Var1);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&stack0xfffffffffffffe60,*(int *)(in_RDI + 0x1e8));
      std::operator<<(poVar2," for OPEN2D");
      uVar3 = __cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      SBPL_Exception::SBPL_Exception
                ((SBPL_Exception *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (string *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    local_1 = search_withslidingbuckets
                        ((SBPL2DGridSearch *)
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (uchar **)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,
                         in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
  }
  return local_1;
}

Assistant:

bool SBPL2DGridSearch::search(unsigned char** Grid2D, unsigned char obsthresh, int startx_c, int starty_c, int goalx_c,
                              int goaly_c, SBPL_2DGRIDSEARCH_TERM_CONDITION termination_condition)
{
    startx_c /= downsample_;
    starty_c /= downsample_;
    goalx_c /= downsample_;
    goaly_c /= downsample_;

    switch (OPENtype_) {
    case SBPL_2DGRIDSEARCH_OPENTYPE_HEAP:
        return SBPL2DGridSearch::search_withheap(Grid2D, obsthresh, startx_c, starty_c, goalx_c, goaly_c,
                                                 termination_condition);
        break;
    case SBPL_2DGRIDSEARCH_OPENTYPE_SLIDINGBUCKETS:
        return SBPL2DGridSearch::search_withslidingbuckets(Grid2D, obsthresh, startx_c, starty_c, goalx_c, goaly_c,
                                                           termination_condition);
        break;
    default:
        std::stringstream ss("ERROR: unknown data structure type = ");
        ss << OPENtype_ << " for OPEN2D";
        throw SBPL_Exception(ss.str());
    };
    return false;
}